

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O0

void __thiscall rst::Parser::ParseBlock(Parser *this,BlockType type,BlockType *prev_type,int indent)

{
  long *plVar1;
  reference pcVar2;
  long lVar3;
  undefined8 uVar4;
  int in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar5;
  int new_indent;
  char *line_start_1;
  size_t size;
  bool literal;
  char c;
  char *s;
  char *end;
  char *line_start;
  bool first;
  string text;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar6;
  string *in_stack_ffffffffffffff38;
  string *s_00;
  bool local_aa;
  long local_90;
  string local_80;
  char *local_50;
  byte local_41;
  string local_40 [28];
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  BlockType type_00;
  undefined4 in_stack_fffffffffffffff0;
  
  std::__cxx11::string::string(local_40);
  local_41 = 1;
  do {
    local_50 = (char *)in_RDI[1];
    if (local_41 == 0) {
      SkipSpace((Parser *)
                CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36,
                                  CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
      type_00 = (BlockType)((ulong)in_RDX >> 0x20);
      if (in_RDI[1] - (long)local_50 != (long)in_ECX) goto LAB_0056d93e;
      if (*(char *)in_RDI[1] == '\n') {
        in_RDI[1] = in_RDI[1] + 1;
LAB_0056d93e:
        s_00 = &local_80;
        std::__cxx11::string::rbegin();
        pcVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  CONCAT24(in_stack_ffffffffffffff34,
                                                           in_stack_ffffffffffffff30))));
        if (*pcVar2 == '\n') {
          in_stack_ffffffffffffff38 = local_40;
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)in_stack_ffffffffffffff38);
        }
        bVar5 = false;
        if (in_ESI == 0) {
          in_stack_ffffffffffffff36 =
               anon_unknown.dwarf_4d08c0::EndsWith(s_00,(char *)in_stack_ffffffffffffff38);
          bVar5 = (bool)in_stack_ffffffffffffff36;
        }
        uVar6 = bVar5;
        if ((bVar5 == false) || (lVar3 = std::__cxx11::string::size(), lVar3 != 2)) {
          local_90 = std::__cxx11::string::size();
          if (bVar5 != false) {
            local_90 = local_90 + -1;
          }
          EnterBlock((Parser *)s_00,(BlockType *)in_stack_ffffffffffffff38,
                     CONCAT13(uVar6,CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)));
          (**(code **)(*(long *)*in_RDI + 0x10))((long *)*in_RDI,in_ESI);
          plVar1 = (long *)*in_RDI;
          uVar4 = std::__cxx11::string::c_str();
          (**(code **)(*plVar1 + 0x20))(plVar1,uVar4,local_90);
          (**(code **)(*(long *)*in_RDI + 0x18))();
        }
        if ((bVar5 != false) &&
           (uVar4 = in_RDI[1],
           SkipSpace((Parser *)
                     CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff36,
                                             CONCAT24(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30)))),
           in_ECX < (int)in_RDI[1] - (int)uVar4)) {
          ParseBlock((Parser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),type_00,
                     (BlockType *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
        }
        std::__cxx11::string::~string(local_40);
        return;
      }
      if (*(char *)in_RDI[1] == '\0') goto LAB_0056d93e;
    }
    local_50 = (char *)in_RDI[1];
    while( true ) {
      bVar5 = false;
      if (*(char *)in_RDI[1] != '\0') {
        bVar5 = *(char *)in_RDI[1] != '\n';
      }
      if (!bVar5) break;
      in_RDI[1] = in_RDI[1] + 1;
    }
    local_80.field_2._8_8_ = in_RDI[1];
    while( true ) {
      local_aa = false;
      if ((char *)local_80.field_2._8_8_ != local_50) {
        local_aa = anon_unknown.dwarf_4d08c0::IsSpace(*(char *)(local_80.field_2._8_8_ + -1));
      }
      if (local_aa == false) break;
      local_80.field_2._8_8_ = local_80.field_2._8_8_ + -1;
    }
    std::__cxx11::string::reserve((ulong)local_40);
    if ((local_41 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_40);
    }
    for (local_80.field_2._M_allocated_capacity = (size_type)local_50;
        local_80.field_2._M_allocated_capacity != local_80.field_2._8_8_;
        local_80.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity + 1) {
      local_80._M_string_length._7_1_ = *(char *)local_80.field_2._M_allocated_capacity;
      if (local_80._M_string_length._7_1_ == '\t') {
        std::__cxx11::string::append((char *)local_40,0x580487);
      }
      else {
        bVar5 = anon_unknown.dwarf_4d08c0::IsSpace(local_80._M_string_length._7_1_);
        if (bVar5) {
          std::__cxx11::string::push_back((char)local_40);
        }
        else {
          std::__cxx11::string::push_back((char)local_40);
        }
      }
    }
    if (*(char *)in_RDI[1] == '\n') {
      in_RDI[1] = in_RDI[1] + 1;
    }
    local_41 = 0;
  } while( true );
}

Assistant:

void rst::Parser::ParseBlock(
    rst::BlockType type, rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (ptr_ - line_start != indent)
        break;
      if (*ptr_ == '\n') {
        ++ptr_;
        break;  // Empty line ends the block.
      }
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;

    // Strip whitespace at the end of the line.
    const char *end = ptr_;
    while (end != line_start && IsSpace(end[-1]))
      --end;

    // Copy text converting all whitespace characters to spaces.
    text.reserve(end - line_start + 1);
    if (!first)
      text.push_back('\n');
    enum {TAB_WIDTH = 8};
    for (const char *s = line_start; s != end; ++s) {
      char c = *s;
      if (c == '\t') {
        text.append("        ",
            TAB_WIDTH - ((indent + s - line_start) % TAB_WIDTH));
      } else if (IsSpace(c)) {
        text.push_back(' ');
      } else {
        text.push_back(*s);
      }
    }
    if (*ptr_ == '\n')
      ++ptr_;
  }

  // Remove a trailing newline.
  if (*text.rbegin() == '\n')
    text.resize(text.size() - 1);

  bool literal = type == PARAGRAPH && EndsWith(text, "::");
  if (!literal || text.size() != 2) {
    std::size_t size = text.size();
    if (literal)
      --size;
    EnterBlock(prev_type, type);
    handler_->StartBlock(type);
    handler_->HandleText(text.c_str(), size);
    handler_->EndBlock();
  }
  if (literal) {
    // Parse a literal block.
    const char *line_start = ptr_;
    SkipSpace();
    int new_indent = static_cast<int>(ptr_ - line_start);
    if (new_indent > indent)
      ParseBlock(LITERAL_BLOCK, prev_type, new_indent);
  }
}